

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O1

void __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::apply
          (iSWAP<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_24_2_357f297d f;
  int *local_58 [2];
  long local_48;
  anon_class_24_2_357f297d local_40;
  
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(local_58,this);
  *local_58[0] = *local_58[0] + offset;
  local_58[0][1] = local_58[0][1] + offset;
  local_40.vector =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_40.lambda._M_value._8_8_ = *(undefined8 *)(&DAT_0049ab60 + (ulong)(op == ConjTrans) * 8);
  local_40.lambda._M_value._0_8_ = 0;
  apply4bc<qclab::qgates::lambda_iSWAP<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_58[0],local_58[0][1],&local_40);
  if (local_58[0] != (int *)0x0) {
    operator_delete(local_58[0],local_48 - (long)local_58[0]);
  }
  return;
}

Assistant:

void iSWAP< T >::apply( Op op , const int nbQubits ,
                          std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_iSWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }